

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gguf.cpp
# Opt level: O0

bool expect_context_not_null(handcrafted_file_type hft)

{
  handcrafted_file_type hft_local;
  undefined1 local_1;
  
  if ((int)hft < 1000) {
    local_1 = 799 < (int)hft;
  }
  else if ((int)hft < 2000) {
    local_1 = 0x707 < (int)hft;
  }
  else if ((int)hft < 3000) {
    local_1 = 0xaef < (int)hft;
  }
  else {
    local_1 = 0xed7 < (int)hft;
  }
  return local_1;
}

Assistant:

static bool expect_context_not_null(const enum handcrafted_file_type hft) {
    if (hft < offset_has_kv) {
        return hft >= HANDCRAFTED_HEADER_EMPTY;
    }
    if (hft < offset_has_tensors) {
        return hft >= HANDCRAFTED_KV_SUCCESS;
    }
    if (hft < offset_has_data) {
        return hft >= HANDCRAFTED_TENSORS_SUCCESS;
    }
    return hft >= HANDCRAFTED_DATA_SUCCESS;
}